

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,TPZGeoBlend<pzgeom::TPZGeoTriangle> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  long lVar1;
  
  TPZNodeRep<3,_pztopology::TPZTriangle>::TPZNodeRep
            ((TPZNodeRep<3,_pztopology::TPZTriangle> *)this,&PTR_PTR_0188ea98,
             (TPZNodeRep<3,_pztopology::TPZTriangle> *)cp,gl2lcNdMap);
  (this->super_TPZGeoTriangle).super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_0188ea38;
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x78);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform
              ((TPZTransform<double> *)((long)(this->fNeighbours + 5) + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x820);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please implement me\n",0x14);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x35);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp, std::map<int64_t, int64_t> &gl2lcNdMap) : TPZRegisterClassId(
                &TPZGeoBlend::ClassId), TGeo(cp, gl2lcNdMap) {
             std::cout << "Please implement me\n";
             DebugStop();
        }